

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_cj(DisasContext_conflict13 *s,DisasOps *o)

{
  int iVar1;
  TCGCond TVar2;
  int d2;
  DisasJumpType DVar3;
  TCGv_i64 pTVar4;
  undefined1 local_40 [8];
  DisasCompare_conflict2 c;
  int iStack_1c;
  _Bool is_imm;
  int m3;
  int imm;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  iVar1 = get_field1(s,FLD_O_m3,FLD_C_i3);
  local_40[0] = (undefined1)ltgt_cond[iVar1];
  if (s->insn->data != 0) {
    TVar2 = tcg_unsigned_cond(ltgt_cond[iVar1] & 0xff);
    local_40[0] = (undefined1)TVar2;
  }
  local_40[3] = true;
  local_40[2] = true;
  local_40[1] = true;
  c._0_8_ = o->in1;
  c.u.s64.a = o->in2;
  c.u._15_1_ = have_field1(s,FLD_O_i4);
  if ((bool)c.u._15_1_) {
    iStack_1c = get_field1(s,FLD_O_i4,FLD_C_b4);
  }
  else {
    iStack_1c = 0;
    iVar1 = get_field1(s,FLD_O_b4,FLD_C_b4);
    d2 = get_field1(s,FLD_O_d4,FLD_C_d4);
    pTVar4 = get_address(s,0,iVar1,d2);
    o->out = pTVar4;
  }
  DVar3 = help_branch(s,(DisasCompare_conflict2 *)local_40,(_Bool)(c.u._15_1_ & 1),iStack_1c,o->out)
  ;
  return DVar3;
}

Assistant:

static DisasJumpType op_cj(DisasContext *s, DisasOps *o)
{
    int imm, m3 = get_field(s, m3);
    bool is_imm;
    DisasCompare c;

    c.cond = ltgt_cond[m3];
    if (s->insn->data) {
        c.cond = tcg_unsigned_cond(c.cond);
    }
    c.is_64 = c.g1 = c.g2 = true;
    c.u.s64.a = o->in1;
    c.u.s64.b = o->in2;

    is_imm = have_field(s, i4);
    if (is_imm) {
        imm = get_field(s, i4);
    } else {
        imm = 0;
        o->out = get_address(s, 0, get_field(s, b4),
                             get_field(s, d4));
    }

    return help_branch(s, &c, is_imm, imm, o->out);
}